

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.c
# Opt level: O2

prf_node_t * prf_state_get_instance(prf_state_t *state,int16_t number)

{
  prf_node_t **pppVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar2 = prf_array_count(state->instances);
  uVar4 = 0;
  uVar3 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar3 = uVar4;
  }
  do {
    if (uVar3 == uVar4) {
      return (prf_node_t *)0x0;
    }
    pppVar1 = state->instances + uVar4;
    uVar4 = uVar4 + 1;
  } while (*(short *)((*pppVar1)->data + 2) != number);
  return *pppVar1;
}

Assistant:

prf_node_t *
prf_state_get_instance(
    prf_state_t * state, 
    int16_t number )
{
    int i, n;

    n = prf_array_count(state->instances);
    for (i = 0; i < n; i++) {
        struct prf_instance_definition_data * data = 
            (struct prf_instance_definition_data *) state->instances[i]->data;
        if ( data->instance_definition_number == number )
            return state->instances[i];
    }
    return NULL;
}